

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext.cpp
# Opt level: O2

Error __thiscall
asmjit::v1_14::FuncArgsContext::markScratchRegs(FuncArgsContext *this,FuncFrame *frame)

{
  uint uVar1;
  WorkData *pWVar2;
  uint uVar3;
  uint uVar4;
  Iterator __begin2;
  uint uVar5;
  RegGroup group;
  RegGroup local_29;
  
  uVar3 = this->_regSwapsMask & 0xfffffffe | (uint)this->_stackDstMask;
  if (uVar3 != 0) {
    for (uVar5 = 0; uVar5 != 4; uVar5 = uVar5 + 1) {
      local_29 = (RegGroup)uVar5;
      if ((uVar3 >> (uVar5 & 0x1f) & 1) != 0) {
        pWVar2 = Support::Array<asmjit::v1_14::FuncArgsContext::WorkData,_4UL>::
                 operator[]<asmjit::v1_14::RegGroup>(&this->_workData,&local_29);
        if (pWVar2->_needsScratch != '\0') {
          uVar1 = pWVar2->_workRegs;
          uVar4 = ~(pWVar2->_dstShuf | pWVar2->_usedRegs) & uVar1;
          if (((uVar4 != 0) || (uVar4 = ~pWVar2->_usedRegs & uVar1, uVar4 != 0)) ||
             (uVar4 = ~uVar1 & pWVar2->_archRegs, uVar4 != 0)) {
            pWVar2->_workRegs = uVar1 | -uVar4 & uVar4;
            FuncFrame::addDirtyRegs(frame,local_29,-uVar4 & uVar4);
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FuncArgsContext::markScratchRegs(FuncFrame& frame) noexcept {
  uint32_t groupMask = 0;

  // Handle stack to stack moves.
  groupMask |= _stackDstMask;

  // Handle register swaps.
  groupMask |= _regSwapsMask & ~Support::bitMask(RegGroup::kGp);

  if (!groupMask)
    return kErrorOk;

  // Selects one dirty register per affected group that can be used as a scratch register.
  for (RegGroup group : RegGroupVirtValues{}) {
    if (Support::bitTest(groupMask, group)) {
      WorkData& wd = _workData[group];
      if (wd._needsScratch) {
        // Initially, pick some clobbered or dirty register.
        RegMask workRegs = wd.workRegs();
        RegMask regs = workRegs & ~(wd.usedRegs() | wd._dstShuf);

        // If that didn't work out pick some register which is not in 'used'.
        if (!regs) {
          regs = workRegs & ~wd.usedRegs();
        }

        // If that didn't work out pick any other register that is allocable.
        // This last resort case will, however, result in marking one more
        // register dirty.
        if (!regs) {
          regs = wd.archRegs() & ~workRegs;
        }

        // If that didn't work out we will have to use XORs instead of MOVs.
        if (!regs) {
          continue;
        }

        RegMask regMask = Support::blsi(regs);
        wd._workRegs |= regMask;
        frame.addDirtyRegs(group, regMask);
      }
    }
  }

  return kErrorOk;
}